

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::putBacktrackingBasis(HEkk *this)

{
  SimplexBasis *this_00;
  reference pvVar1;
  vector<double,_std::allocator<double>_> *this_01;
  const_reference pvVar2;
  HEkk *in_RDI;
  HighsInt i;
  vector<int,_std::allocator<int>_> *basicIndex;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  int local_14;
  
  this_00 = &in_RDI->basis_;
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffd8);
  for (local_14 = 0; local_14 < (in_RDI->lp_).num_row_; local_14 = local_14 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->dual_edge_weight_,(long)local_14);
    in_stack_ffffffffffffffd8 = (vector<int,_std::allocator<int>_> *)*pvVar1;
    this_01 = &in_RDI->scattered_dual_edge_weight_;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this_00->basicIndex_,(long)local_14);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)*pvVar2);
    *pvVar1 = (value_type)in_stack_ffffffffffffffd8;
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffd8);
  putBacktrackingBasis(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void HEkk::putBacktrackingBasis() {
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;
  analysis_.simplexTimerStart(PermWtClock);
  for (HighsInt i = 0; i < lp_.num_row_; i++)
    scattered_dual_edge_weight_[basicIndex[i]] = dual_edge_weight_[i];
  analysis_.simplexTimerStop(PermWtClock);
  putBacktrackingBasis(basicIndex);
}